

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.h
# Opt level: O3

void __thiscall chrono::ChLinkMateOrthogonal::ChLinkMateOrthogonal(ChLinkMateOrthogonal *this)

{
  double dVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  
  ChLinkMateGeneric::ChLinkMateGeneric
            (&this->super_ChLinkMateGeneric,false,false,false,true,false,false);
  (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem
  .super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkMateGeneric_00b1c3f8;
  auVar2._8_8_ = DAT_00b689c0;
  auVar2._0_8_ = DAT_00b689c0;
  auVar2._16_8_ = DAT_00b689c0;
  auVar2._24_8_ = DAT_00b689c0;
  auVar3._8_8_ = VECT_Y;
  auVar3._0_8_ = VECT_Y;
  auVar3._16_8_ = VECT_Y;
  auVar3._24_8_ = VECT_Y;
  auVar2 = vblendps_avx(ZEXT1632(_VECT_X),auVar2,0x30);
  auVar2 = vblendps_avx(auVar2,auVar3,0xc0);
  this->reldir1 = (ChVector<double>)auVar2._0_24_;
  dVar1 = DAT_00b689d8;
  (this->reldir2).m_data[0] = (double)auVar2._24_8_;
  (this->reldir2).m_data[1] = DAT_00b689d0;
  (this->reldir2).m_data[2] = dVar1;
  return;
}

Assistant:

virtual ~ChLinkMateOrthogonal() {}